

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Measurement.cpp
# Opt level: O1

VectorXd __thiscall LidarMeasurement::InitializeState(LidarMeasurement *this,int n)

{
  Sensor *pSVar1;
  _func_int **pp_Var2;
  undefined8 *puVar3;
  Index size;
  Index index;
  Sensor *pSVar4;
  int in_EDX;
  long lVar5;
  undefined4 in_register_00000034;
  Index othersize;
  VectorXd VVar6;
  
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)this,(long)in_EDX,(long)in_EDX,1);
  if (in_EDX < 0) {
    __assert_fail("dim >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Matrix.h"
                  ,0xf0,
                  "Eigen::Matrix<double, -1, 1>::Matrix(Index) [_Scalar = double, _Rows = -1, _Cols = 1, _Options = 0, _MaxRows = -1, _MaxCols = 1]"
                 );
  }
  pSVar4 = (this->super_Measurement).sensor_;
  if ((long)pSVar4 < 0) {
    __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x3f,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,(Index)pSVar4,1);
  pSVar1 = (this->super_Measurement).sensor_;
  if (pSVar1 != pSVar4) {
    __assert_fail("rows() == other.rows() && cols() == other.cols()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Assign.h"
                  ,0x1f9,
                  "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>]"
                 );
  }
  pSVar4 = (Sensor *)((long)pSVar1 - ((long)pSVar1 >> 0x3f) & 0xfffffffffffffffe);
  if (1 < (long)pSVar1) {
    lVar5 = 0;
    do {
      pp_Var2 = (this->super_Measurement)._vptr_Measurement + lVar5;
      *pp_Var2 = (_func_int *)0x3fb999999999999a;
      pp_Var2[1] = (_func_int *)0x3fb999999999999a;
      lVar5 = lVar5 + 2;
    } while (lVar5 < (long)pSVar4);
  }
  if ((long)pSVar4 < (long)pSVar1) {
    pp_Var2 = (this->super_Measurement)._vptr_Measurement;
    do {
      pp_Var2[(long)pSVar4] = (_func_int *)0x3fb999999999999a;
      pSVar4 = (Sensor *)((long)&pSVar4->_vptr_Sensor + 1);
    } while (pSVar1 != pSVar4);
  }
  lVar5 = *(long *)(CONCAT44(in_register_00000034,n) + 0x20);
  if (0 < lVar5) {
    pSVar4 = (this->super_Measurement).sensor_;
    if (0 < (long)pSVar4) {
      puVar3 = *(undefined8 **)(CONCAT44(in_register_00000034,n) + 0x18);
      pp_Var2 = (this->super_Measurement)._vptr_Measurement;
      *pp_Var2 = (_func_int *)*puVar3;
      if (lVar5 == 1) goto LAB_00112358;
      if (pSVar4 != (Sensor *)0x1) {
        pp_Var2[1] = (_func_int *)puVar3[1];
        VVar6.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             (DenseIndex)pSVar4;
        VVar6.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)this;
        return (VectorXd)
               VVar6.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
      }
    }
    __assert_fail("index >= 0 && index < size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/DenseCoeffsBase.h"
                  ,0x18a,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
LAB_00112358:
  __assert_fail("index >= 0 && index < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/DenseCoeffsBase.h"
                ,0x9c,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator[](Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

VectorXd LidarMeasurement::InitializeState(int n) const {

    VectorXd x(n);
    // initialize the state vector
    x.fill(0.1);
    x(0) = measurements_[0];
    x(1) = measurements_[1];
    //x(0) = (fabs(measurements_[0]) < 0.01) ? 0.01 : measurements_[0];
    //x(1) = (fabs(measurements_[1]) < 0.01) ? 0.01 : measurements_[1];
    return x;
}